

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_library.hpp
# Opt level: O1

bool __thiscall
rtw::DynamicLibrary::load
          (DynamicLibrary *this,
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *search_paths)

{
  string *path;
  pointer pcVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Elt_pointer this_00;
  bool bVar3;
  undefined1 local_88 [8];
  string full_path;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Map_pointer local_38;
  
  if (this->library_ != (void *)0x0) {
    dlclose();
  }
  this_00 = (search_paths->
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_48 = (search_paths->
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_48 != this_00) {
    local_40 = (search_paths->
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_last;
    local_38 = (search_paths->
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Deque_impl_data._M_start._M_node;
    bVar3 = false;
    do {
      pcVar1 = (this->name_)._M_dataplus._M_p;
      path = (string *)((long)&full_path.field_2 + 8);
      full_path.field_2._8_8_ = &stack0xffffffffffffffa8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)path,pcVar1,pcVar1 + (this->name_)._M_string_length);
      fs::join<std::__cxx11::string>((string *)local_88,(fs *)this_00,path,in_RCX);
      if ((undefined1 *)full_path.field_2._8_8_ != &stack0xffffffffffffffa8) {
        operator_delete((void *)full_path.field_2._8_8_);
      }
      pvVar2 = (void *)dlopen(local_88,1);
      this->library_ = pvVar2;
      if (local_88 != (undefined1  [8])&full_path._M_string_length) {
        operator_delete((void *)local_88);
      }
      if (pvVar2 != (void *)0x0) {
        if (!bVar3) {
          return true;
        }
        break;
      }
      this_00 = this_00 + 1;
      if (this_00 == local_40) {
        this_00 = local_38[1];
        local_38 = local_38 + 1;
        local_40 = this_00 + 0x10;
      }
      bVar3 = this_00 == local_48;
    } while (!bVar3);
  }
  pvVar2 = (void *)dlopen((this->name_)._M_dataplus._M_p,1);
  this->library_ = pvVar2;
  return pvVar2 != (void *)0x0;
}

Assistant:

inline bool DynamicLibrary::load(const std::deque<std::string> & search_paths)
{
	if(library_)
	{
		dylib::close(library_);
	}

	if(!search_paths.empty())
	{
		for(const auto & search_path : search_paths)
		{
			const auto full_path = fs::join(search_path, name_);

			library_ = dylib::load(full_path);

			if(library_) return true;
		}
	}

	return (library_ = dylib::load(name_)) != nullptr;
}